

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int ARKodeSetMassLSNormFactor(void *arkode_mem,sunrealtype nrmfac)

{
  long lVar1;
  long lVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  double dVar4;
  double dVar5;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x675;
LAB_0013d10f:
    arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetMassLSNormFactor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,msgfmt);
    return iVar3;
  }
  if (*(int *)((long)arkode_mem + 0x1e8) == 0) {
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    iVar3 = -0x30;
    error_code = -0x30;
    line = 0x67e;
    goto LAB_0013d10f;
  }
  lVar1 = (**(code **)((long)arkode_mem + 0x200))(arkode_mem);
  if (lVar1 == 0) {
    arkProcessError((ARKodeMem)arkode_mem,-6,0xfe9,"ARKodeSetMassLSNormFactor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                    ,"Mass matrix solver memory is NULL.");
    return -6;
  }
  if (0.0 < nrmfac) {
    *(sunrealtype *)(lVar1 + 0x30) = nrmfac;
    return 0;
  }
  if (0.0 <= nrmfac) {
    lVar2 = N_VGetLength(*(undefined8 *)((long)arkode_mem + 0x248));
    if (lVar2 < 1) {
      dVar5 = 0.0;
      goto LAB_0013d19c;
    }
    lVar2 = N_VGetLength(*(undefined8 *)((long)arkode_mem + 0x248));
    dVar5 = (double)lVar2;
  }
  else {
    N_VConst(0x3ff0000000000000);
    dVar4 = (double)N_VDotProd(*(undefined8 *)((long)arkode_mem + 0x248),
                               *(undefined8 *)((long)arkode_mem + 0x248));
    dVar5 = 0.0;
    if (dVar4 <= 0.0) goto LAB_0013d19c;
    dVar5 = (double)N_VDotProd(*(undefined8 *)((long)arkode_mem + 0x248),
                               *(undefined8 *)((long)arkode_mem + 0x248));
  }
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
LAB_0013d19c:
  *(double *)(lVar1 + 0x30) = dVar5;
  return 0;
}

Assistant:

int ARKodeSetMassLSNormFactor(void* arkode_mem, sunrealtype nrmfac)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structures */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* store input and return */
  if (nrmfac > ZERO)
  {
    /* set user-provided factor */
    arkls_mem->nrmfac = nrmfac;
  }
  else if (nrmfac < ZERO)
  {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, ark_mem->tempv1);
    arkls_mem->nrmfac = SUNRsqrt(N_VDotProd(ark_mem->tempv1, ark_mem->tempv1));
  }
  else
  {
    /* compute default factor for WRMS norm from vector legnth */
    arkls_mem->nrmfac = SUNRsqrt(N_VGetLength(ark_mem->tempv1));
  }

  return (ARKLS_SUCCESS);
}